

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * cmTargetPropertyComputer::GetSources<cmTarget>
                 (cmTarget *tgt,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  MessageType t;
  undefined8 uVar2;
  bool bVar3;
  PolicyStatus PVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  size_type sVar8;
  cmMakefile *this;
  cmSourceFile *this_00;
  string *psVar9;
  ulong uVar10;
  PolicyID id;
  string local_470 [32];
  string local_450 [8];
  string sname;
  cmSourceFileLocation *location;
  cmSourceFile *sf;
  string local_400;
  cmStateSnapshot local_3e0;
  MessageType local_3c4;
  undefined1 local_3c0 [4];
  MessageType messageType;
  ostringstream e;
  undefined1 local_240 [2];
  bool noMessage;
  bool addContent;
  string objLibName;
  string *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string *entry;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmStringRange *__range1;
  char *sep;
  ostringstream ss;
  undefined1 local_38 [8];
  cmStringRange entries;
  cmListFileBacktrace *context_local;
  cmMessenger *messenger_local;
  cmTarget *tgt_local;
  
  entries.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context;
  _local_38 = cmTarget::GetSourceEntries_abi_cxx11_(tgt);
  bVar3 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::empty((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_38);
  if (bVar3) {
    tgt_local = (cmTarget *)0x0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep);
    __range1 = (cmStringRange *)0x8e0830;
    __begin1._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    local_1c8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)__begin1._M_current);
    entry = (string *)
            cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)__begin1._M_current);
    while (bVar3 = __gnu_cxx::operator!=
                             (&local_1c8,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&entry), bVar3) {
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
      cmSystemTools::ExpandListArgument
                (files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,false);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      file = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&file), bVar3) {
        objLibName.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        bVar3 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           objLibName.field_2._8_8_,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((bVar3) &&
           (pcVar6 = (char *)std::__cxx11::string::back(), uVar2 = objLibName.field_2._8_8_,
           *pcVar6 == '>')) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_240,uVar2);
          sVar8 = cmGeneratorExpression::Find((string *)local_240);
          if (sVar8 == 0xffffffffffffffff) {
            bVar1 = false;
            bVar3 = true;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c0);
            local_3c4 = AUTHOR_WARNING;
            cmListFileBacktrace::GetBottom(&local_3e0,(cmListFileBacktrace *)entries.End._M_current)
            ;
            PVar4 = cmStateSnapshot::GetPolicy(&local_3e0,CMP0051,false);
            if (PVar4 != OLD) {
              if (PVar4 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_400,(cmPolicies *)0x33,id);
                poVar7 = std::operator<<((ostream *)local_3c0,(string *)&local_400);
                std::operator<<(poVar7,"\n");
                std::__cxx11::string::~string((string *)&local_400);
                bVar3 = false;
              }
              else if (PVar4 - NEW < 3) {
                bVar1 = true;
              }
            }
            if (!bVar3) {
              poVar7 = std::operator<<((ostream *)local_3c0,"Target \"");
              psVar9 = cmTarget::GetName_abi_cxx11_(tgt);
              poVar7 = std::operator<<(poVar7,(string *)psVar9);
              std::operator<<(poVar7,
                              "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                             );
              t = local_3c4;
              std::__cxx11::ostringstream::str();
              cmMessenger::IssueMessage
                        (messenger,t,(string *)&sf,(cmListFileBacktrace *)entries.End._M_current);
              std::__cxx11::string::~string((string *)&sf);
            }
            if (bVar1) {
              std::operator<<((ostream *)&sep,(char *)__range1);
              __range1 = (cmStringRange *)0x8ac2b7;
              std::operator<<((ostream *)&sep,(string *)objLibName.field_2._8_8_);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c0);
          }
          else {
            std::operator<<((ostream *)&sep,(char *)__range1);
            __range1 = (cmStringRange *)0x8ac2b7;
            std::operator<<((ostream *)&sep,(string *)objLibName.field_2._8_8_);
          }
          std::__cxx11::string::~string((string *)local_240);
        }
        else {
          sVar8 = cmGeneratorExpression::Find(objLibName.field_2._8_8_);
          if (sVar8 == 0xffffffffffffffff) {
            std::operator<<((ostream *)&sep,(char *)__range1);
            std::operator<<((ostream *)&sep,(string *)objLibName.field_2._8_8_);
          }
          else {
            this = cmTarget::GetMakefile(tgt);
            this_00 = cmMakefile::GetOrCreateSource
                                (this,(string *)objLibName.field_2._8_8_,false,Ambiguous);
            sname.field_2._8_8_ = cmSourceFile::GetLocation(this_00);
            psVar9 = cmSourceFileLocation::GetDirectory_abi_cxx11_
                               ((cmSourceFileLocation *)sname.field_2._8_8_);
            std::__cxx11::string::string(local_450,(string *)psVar9);
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              std::__cxx11::string::operator+=(local_450,"/");
            }
            psVar9 = cmSourceFileLocation::GetName_abi_cxx11_
                               ((cmSourceFileLocation *)sname.field_2._8_8_);
            std::__cxx11::string::operator+=(local_450,(string *)psVar9);
            std::operator<<((ostream *)&sep,(char *)__range1);
            std::operator<<((ostream *)&sep,local_450);
            std::__cxx11::string::~string(local_450);
          }
          __range1 = (cmStringRange *)0x8ac2b7;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1c8);
    }
    if ((GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
         srcs_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                                     ::srcs_abi_cxx11_), iVar5 != 0)) {
      std::__cxx11::string::string
                ((string *)
                 &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                  srcs_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                    srcs_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                           ::srcs_abi_cxx11_);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                srcs_abi_cxx11_,local_470);
    std::__cxx11::string::~string(local_470);
    tgt_local = (cmTarget *)std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep);
  }
  return (char *)tgt_local;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::string const& entry : entries) {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}